

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

bool __thiscall
unodb::
olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::iterator::try_first(iterator *this)

{
  bool bVar1;
  atomic<long> *paVar2;
  version_type other;
  olc_node_ptr local_e8;
  basic_node_ptr<unodb::detail::olc_node_header> node;
  undefined1 local_d8 [8];
  read_critical_section parent_critical_section;
  iterator *this_local;
  bool result;
  bool result_1;
  bool result_2;
  version_type local_68;
  long local_60;
  __int_type_conflict old_value;
  long local_50;
  memory_order local_48;
  int local_44;
  memory_order __b;
  undefined4 local_34;
  long local_30;
  undefined8 local_28;
  undefined4 local_1c;
  undefined8 local_18;
  atomic<long> *local_10;
  
  parent_critical_section.version.version = (version_tag_type)this;
  invalidate(this);
  optimistic_lock::try_read_lock((optimistic_lock *)local_d8);
  bVar1 = optimistic_lock::read_critical_section::must_restart((read_critical_section *)local_d8);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    local_e8.tagged_ptr =
         (uintptr_t)
         in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>::load
                   (&this->db_->root);
    bVar1 = detail::basic_node_ptr<unodb::detail::olc_node_header>::operator==
                      (&local_e8,(nullptr_t)0x0);
    if (bVar1) {
      paVar2 = (atomic<long> *)((long)local_d8 + 8);
      local_44 = 2;
      ___b = paVar2;
      local_48 = std::operator&(acquire,__memory_order_mask);
      if (local_44 - 1U < 2) {
        local_50 = (paVar2->super___atomic_base<long>)._M_i;
      }
      else if (local_44 == 5) {
        local_50 = (paVar2->super___atomic_base<long>)._M_i;
      }
      else {
        local_50 = (paVar2->super___atomic_base<long>)._M_i;
      }
      if (local_50 < 1) {
        __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                      ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
      }
      local_34 = 2;
      other = optimistic_lock::atomic_version_type::load_relaxed((atomic_version_type *)local_d8);
      this_local._7_1_ = optimistic_lock::version_type::operator==(&local_68,other);
      if (((this_local._7_1_ ^ 0xffU) & 1) != 0) {
        optimistic_lock::dec_read_lock_count((optimistic_lock *)local_d8);
      }
      if (this_local._7_1_) {
        local_10 = (atomic<long> *)((long)local_d8 + 8);
        local_18 = 1;
        local_1c = 3;
        local_28 = 1;
        LOCK();
        local_60 = (local_10->super___atomic_base<long>)._M_i;
        (local_10->super___atomic_base<long>)._M_i = (local_10->super___atomic_base<long>)._M_i + -1
        ;
        UNLOCK();
        local_30 = local_60;
        if (local_60 < 1) {
          __assert_fail("old_value > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                        ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
        }
      }
      local_d8 = (undefined1  [8])0x0;
    }
    else {
      this_local._7_1_ = try_left_most_traversal(this,local_e8,(read_critical_section *)local_d8);
    }
  }
  node.tagged_ptr._4_4_ = 1;
  optimistic_lock::read_critical_section::~read_critical_section((read_critical_section *)local_d8);
  return this_local._7_1_;
}

Assistant:

bool olc_db<Key, Value>::iterator::try_first() {
  invalidate();  // clear the stack
  auto parent_critical_section = db_.root_pointer_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(parent_critical_section.must_restart()))
    return false;  // LCOV_EXCL_LINE
  auto node{db_.root.load()};
  if (UNODB_DETAIL_UNLIKELY(node == nullptr)) {
    return UNODB_DETAIL_LIKELY(parent_critical_section.try_read_unlock());
  }
  return try_left_most_traversal(node, parent_critical_section);
}